

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickManager.cpp
# Opt level: O2

void __thiscall sf::priv::JoystickManager::JoystickManager(JoystickManager *this)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    Item::Item((Item *)(this->m_joysticks[0].joystick.m_mapping + lVar1 + -4));
    lVar1 = lVar1 + 0x128;
  } while (lVar1 != 0x940);
  JoystickImpl::initialize();
  return;
}

Assistant:

JoystickManager::JoystickManager()
{
    JoystickImpl::initialize();
}